

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# findClique.cpp
# Opt level: O2

int maxClique(CGraphIO *gio,int l_bound,vector<int,_std::allocator<int>_> *max_clique_data)

{
  uint idx;
  vector<int,_std::allocator<int>_> *ptrVtx;
  int iVar1;
  void *__s;
  ulong uVar2;
  pointer piVar3;
  int *piVar4;
  long lVar5;
  long lVar6;
  int local_74;
  uint local_70;
  int maxClq;
  vector<int,_std::allocator<int>_> max_clique_data_inter;
  vector<int,_std::allocator<int>_> U;
  
  U.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  U.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  U.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::reserve
            (&U,((long)(gio->m_vi_Vertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)(gio->m_vi_Vertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start) * 0x40000000 + -0x100000000 >> 0x20);
  max_clique_data_inter.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  max_clique_data_inter.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  max_clique_data_inter.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::reserve
            (&max_clique_data_inter,
             ((long)(gio->m_vi_Vertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)(gio->m_vi_Vertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start) * 0x40000000 + -0x100000000 >> 0x20);
  std::vector<int,_std::allocator<int>_>::reserve
            (max_clique_data,
             ((long)(gio->m_vi_Vertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)(gio->m_vi_Vertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start) * 0x40000000 + -0x100000000 >> 0x20);
  pruned1 = 0;
  pruned2 = 0;
  pruned3 = 0;
  pruned5 = 0;
  local_70 = (int)((ulong)((long)(gio->m_vi_Vertices).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)(gio->m_vi_Vertices).super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 2) - 1;
  uVar2 = 0xffffffffffffffff;
  if (-1 < (int)local_70) {
    uVar2 = (long)(int)local_70 * 4;
  }
  maxClq = l_bound;
  __s = operator_new__(uVar2);
  ptrVtx = &gio->m_vi_Vertices;
  memset(__s,0,(long)(int)local_70 * 4);
  local_74 = l_bound;
  do {
    while( true ) {
      idx = local_70 - 1;
      if ((int)local_70 < 1) {
        local_70 = idx;
        operator_delete__(__s);
        if (max_clique_data_inter.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            max_clique_data_inter.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start) {
          max_clique_data_inter.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               max_clique_data_inter.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
        }
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&max_clique_data_inter.super__Vector_base<int,_std::allocator<int>_>);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&U.super__Vector_base<int,_std::allocator<int>_>);
        return local_74;
      }
      *(undefined4 *)((long)__s + (ulong)idx * 4) = 1;
      if (U.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
          != U.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start) {
        U.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
             U.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
      }
      local_70 = idx;
      iVar1 = getDegree(ptrVtx,idx);
      if (local_74 <= iVar1) break;
      pruned1 = pruned1 + 1;
    }
    uVar2 = (ulong)(int)local_70;
    piVar3 = (ptrVtx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_start;
    lVar6 = (long)piVar3[uVar2];
    lVar5 = lVar6 * 4;
    for (; lVar6 < piVar3[(long)(int)uVar2 + 1]; lVar6 = lVar6 + 1) {
      iVar1 = *(int *)((long)(gio->m_vi_Edges).super__Vector_base<int,_std::allocator<int>_>._M_impl
                             .super__Vector_impl_data._M_start + lVar5);
      piVar4 = &pruned2;
      if (*(int *)((long)__s + (long)iVar1 * 4) == 1) {
LAB_00127bcd:
        *piVar4 = *piVar4 + 1;
      }
      else {
        iVar1 = getDegree(ptrVtx,iVar1);
        piVar4 = &pruned3;
        if (iVar1 < local_74) goto LAB_00127bcd;
        std::vector<int,_std::allocator<int>_>::push_back
                  (&U,(value_type_conflict1 *)
                      ((long)(gio->m_vi_Edges).super__Vector_base<int,_std::allocator<int>_>._M_impl
                             .super__Vector_impl_data._M_start + lVar5));
      }
      uVar2 = (ulong)local_70;
      piVar3 = (ptrVtx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar5 = lVar5 + 4;
    }
    maxCliqueHelper(gio,&U,1,&maxClq,&max_clique_data_inter);
    iVar1 = maxClq;
    if (local_74 < maxClq) {
      std::vector<int,_std::allocator<int>_>::push_back
                (&max_clique_data_inter,(value_type_conflict1 *)&local_70);
      std::vector<int,_std::allocator<int>_>::operator=(max_clique_data,&max_clique_data_inter);
    }
    if (max_clique_data_inter.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        max_clique_data_inter.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start) {
      max_clique_data_inter.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           max_clique_data_inter.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
    local_74 = iVar1;
  } while( true );
}

Assistant:

int maxClique( CGraphIO& gio, int l_bound, vector<int>& max_clique_data )
{
	vector <int>* ptrVertex = gio.GetVerticesPtr();
	vector <int>* ptrEdge = gio.GetEdgesPtr();
	vector <int> U;
   	U.reserve(gio.GetVertexCount());
   	vector<int> max_clique_data_inter;
   	max_clique_data_inter.reserve(gio.GetVertexCount());
   	max_clique_data.reserve(gio.GetVertexCount());
	int maxClq = l_bound;
   	int prev_maxClq;

	pruned1 = 0;
	pruned2 = 0;
	pruned3 = 0;
	pruned5 = 0;

	//Bit Vector to track if vertex has been considered previously.
	int *bitVec = new int[gio.GetVertexCount()];
	memset(bitVec, 0, gio.GetVertexCount() * sizeof(int));

	for(int i = gio.GetVertexCount()-1; i >= 0; i--)
	{
		bitVec[i] = 1;
      prev_maxClq = maxClq;

		U.clear();
		//Pruning 1
		if( getDegree(ptrVertex, i) < maxClq)
		{
			pruned1++;
			continue;
		}

		for( int j = (*ptrVertex)[i]; j < (*ptrVertex)[i + 1]; j++ )
		{	
			//Pruning 2
			if(bitVec[(*ptrEdge)[j]] != 1)
			{
				//Pruning 3
				if( getDegree(ptrVertex, (*ptrEdge)[j]) >=  maxClq )			
					U.push_back((*ptrEdge)[j]);
				else
					pruned3++;
			}
			else 
				pruned2++;
		}

		maxCliqueHelper( gio, &U, 1, maxClq, max_clique_data_inter );

      if(maxClq > prev_maxClq)
      {
         max_clique_data_inter.push_back(i);
         max_clique_data = max_clique_data_inter;
		}
		max_clique_data_inter.clear();
	}

   delete [] bitVec;
   max_clique_data_inter.clear();

#ifdef _DEBUG
	cout << "Pruning 1 = " << pruned1 << endl;
	cout << "Pruning 2 = " << pruned2 << endl;
	cout << "Pruning 3 = " << pruned3 << endl;
	cout << "Pruning 5 = " << pruned5 << endl;
#endif

		return maxClq;
}